

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattr_set.c
# Opt level: O0

int lattr_pset(uchar *val,mpt_convertable *src,int *def)

{
  uint local_34;
  byte local_2d;
  int32_t tmp;
  uint8_t sym;
  int *piStack_28;
  int len;
  int *def_local;
  mpt_convertable *src_local;
  uchar *val_local;
  
  if (src == (mpt_convertable *)0x0) {
    *val = (uchar)*def;
    return 0;
  }
  piStack_28 = def;
  def_local = (int *)src;
  src_local = (mpt_convertable *)val;
  tmp = (*src->_vptr->convert)(src,0x79,&local_2d);
  if (tmp < 0) {
    local_34 = (uint)*(byte *)&src_local->_vptr;
    tmp = (*(code *)**(undefined8 **)def_local)(def_local,0x69,&local_34);
    if (tmp < 0) {
      return tmp;
    }
    if (((int)local_34 < 0) || (0xff < (int)local_34)) {
      return -2;
    }
    local_2d = (byte)local_34;
  }
  if (tmp == 0) {
    *(char *)&src_local->_vptr = (char)*piStack_28;
    val_local._4_4_ = 0;
  }
  else if (((int)(uint)local_2d < piStack_28[1]) || (piStack_28[2] < (int)(uint)local_2d)) {
    val_local._4_4_ = -2;
  }
  else {
    *(byte *)&src_local->_vptr = local_2d;
    val_local._4_4_ = 0;
  }
  return val_local._4_4_;
}

Assistant:

static int lattr_pset(unsigned char *val, MPT_INTERFACE(convertable) *src, int def[3])
{
	int len;
	uint8_t sym;
	
	if (!src) {
		*val = def[0];
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'y', &sym)) < 0) {
		int32_t tmp = *val;
		if ((len = src->_vptr->convert(src, 'i', &tmp)) < 0) {
			return len;
		}
		if (tmp < 0 || tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		sym = tmp;
	}
	if (!len) {
		*val = def[0];
		return 0;
	}
	if (sym < def[1] || sym > def[2]) {
		return MPT_ERROR(BadValue);
	}
	*val = sym;
	
	return 0;
}